

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DragFloatRange2
               (char *label,float *v_current_min,float *v_current_max,float v_speed,float v_min,
               float v_max,char *display_format,char *display_format_max,float power)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  char *text_end;
  float v_min_00;
  char *local_a0;
  float local_94;
  float local_7c;
  float local_74;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  float power_local;
  char *display_format_max_local;
  char *display_format_local;
  float v_max_local;
  float v_min_local;
  float v_speed_local;
  float *v_current_max_local;
  float *v_current_min_local;
  char *label_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2,0.0);
    if (v_min < v_max) {
      local_7c = ImMin(v_max,*v_current_max);
      local_74 = v_min;
    }
    else {
      local_74 = -3.4028235e+38;
      local_7c = *v_current_max;
    }
    bVar2 = DragFloat("##min",v_current_min,v_speed,local_74,local_7c,display_format,power);
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    if (v_min < v_max) {
      v_min_00 = ImMax(v_min,*v_current_min);
      local_94 = v_max;
    }
    else {
      v_min_00 = *v_current_min;
      local_94 = 3.4028235e+38;
    }
    local_a0 = display_format;
    if (display_format_max != (char *)0x0) {
      local_a0 = display_format_max;
    }
    bVar3 = DragFloat("##max",v_current_max,v_speed,v_min_00,local_94,local_a0,power);
    label_local._7_1_ = bVar2 || bVar3;
    PopItemWidth();
    SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
    PopID();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* display_format, const char* display_format_max, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2);

    bool value_changed = DragFloat("##min", v_current_min, v_speed, (v_min >= v_max) ? -FLT_MAX : v_min, (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max), display_format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);
    value_changed |= DragFloat("##max", v_current_max, v_speed, (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min), (v_min >= v_max) ? FLT_MAX : v_max, display_format_max ? display_format_max : display_format, power);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}